

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O1

void easm_print_mods(FILE *out,envy_colors *cols,easm_mods *mods,int spcafter)

{
  long lVar1;
  
  if (0 < mods->modsnum) {
    lVar1 = 0;
    do {
      if (spcafter == 0) {
        fputc(0x20,(FILE *)out);
        easm_print_mod(out,cols,mods->mods[lVar1]);
      }
      else {
        easm_print_mod(out,cols,mods->mods[lVar1]);
        fputc(0x20,(FILE *)out);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < mods->modsnum);
  }
  return;
}

Assistant:

void easm_print_mods(FILE *out, const struct envy_colors *cols, struct easm_mods *mods, int spcafter) {
	int i;
	for (i = 0; i < mods->modsnum; i++) {
		if (!spcafter)
			fprintf(out, " ");
		easm_print_mod(out, cols, mods->mods[i]);
		if (spcafter)
			fprintf(out, " ");
	}
}